

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::DebuggerScope::UpdateDueToByteCodeRegeneration
          (DebuggerScope *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar4;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  DebuggerScope **ppDVar5;
  nullptr_t local_28;
  RegSlot local_1c;
  int local_18;
  RegSlot scopeLocation_local;
  int start_local;
  DiagExtraScopesType scopeType_local;
  DebuggerScope *this_local;
  
  local_1c = scopeLocation;
  local_18 = start;
  scopeLocation_local = scopeType;
  _start_local = this;
  if ((this->scopeType != DiagUnknownScope) && (this->scopeType != scopeType)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x171e,"(this->scopeType == scopeType)",
                                "The debugger scope type should not have changed when generating bytecode again."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->scopeType = scopeLocation_local;
  SetBegin(this,local_18);
  ppLVar4 = Memory::WriteBarrierPtr::operator_cast_to_List__
                      ((WriteBarrierPtr *)&this->scopeProperties);
  if (*ppLVar4 !=
      (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              ::operator->(&this->scopeProperties);
    JsUtil::
    List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Clear(this_00);
  }
  SetScopeLocation(this,local_1c);
  ppDVar5 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__
                      ((WriteBarrierPtr *)&this->siblingScope);
  if (*ppDVar5 != (DebuggerScope *)0x0) {
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::DebuggerScope>::operator=(&this->siblingScope,&local_28);
  }
  return;
}

Assistant:

void DebuggerScope::UpdateDueToByteCodeRegeneration(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation)
    {
#if DBG
        if (this->scopeType != Js::DiagUnknownScope)
        {
            // If the scope is unknown, it was deserialized without a scope type.  Otherwise, it should not have changed.
            // The scope type can change on a re-parse in certain scenarios related to eval detection in legacy mode -> Winblue: 272122
            AssertMsg(this->scopeType == scopeType, "The debugger scope type should not have changed when generating bytecode again.");
        }
#endif // DBG

        this->scopeType = scopeType;
        this->SetBegin(start);
        if(this->scopeProperties)
        {
            this->scopeProperties->Clear();
        }

        // Reset the scope location as it may have changed during bytecode generation from the last run.
        this->SetScopeLocation(scopeLocation);

        if (siblingScope)
        {
            // If we had a sibling scope during initial parsing, clear it now so that it will be reset
            // when it is retrieved during this bytecode generation pass, in GetSiblingScope().
            // GetSiblingScope() will ensure that the FunctionBody currentDebuggerScopeIndex value is
            // updated accordingly to account for future scopes coming after the sibling.
            // Calling of GetSiblingScope() will happen when register properties are added to this scope
            // via TrackRegisterPropertyForDebugger().
            siblingScope = nullptr;
        }
    }